

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

void ray_intersect_triangles_all
               (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  vec3 c;
  undefined1 auVar11 [16];
  _Bool _Var12;
  ulong uVar13;
  vec3 *pvVar14;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar15;
  float fVar16;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float t0;
  undefined8 local_68;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  p.z = ro.z;
  auVar10._8_4_ = in_XMM0_Dc;
  auVar10._0_8_ = ro._0_8_;
  auVar10._12_4_ = in_XMM0_Dd;
  if (0 < num_points) {
    local_4c = transform.m[3];
    local_50 = transform.m[7];
    local_54 = transform.m[8];
    local_58 = transform.m[0xb];
    local_48._0_4_ = rd.x;
    local_48._4_4_ = rd.y;
    local_38._0_4_ = ro.x;
    local_38._4_4_ = ro.y;
    local_48._4_4_ = local_48._4_4_ + (float)local_38._4_4_;
    local_48._0_4_ = (float)local_48 + (float)local_38._0_4_;
    fStack_40 = in_XMM2_Dc + in_XMM0_Dc;
    fStack_3c = in_XMM2_Dd + in_XMM0_Dd;
    pvVar14 = points + 2;
    uVar13 = 0;
    local_38 = auVar10;
    do {
      auVar11 = local_38;
      auVar10 = _local_48;
      uVar3 = pvVar14[-2].x;
      uVar5 = pvVar14[-2].y;
      fVar1 = pvVar14[-2].z;
      uVar4 = pvVar14[-1].x;
      uVar6 = pvVar14[-1].y;
      fVar2 = pvVar14[-1].z;
      uVar8 = pvVar14->x;
      uVar9 = pvVar14->y;
      fVar7 = pvVar14->z;
      a.x = transform.m[2] * fVar1 + transform.m[0] * (float)uVar3 + (float)uVar5 * transform.m[1] +
            local_4c;
      a.y = transform.m[6] * fVar1 + transform.m[4] * (float)uVar3 + (float)uVar5 * transform.m[5] +
            local_50;
      b.x = transform.m[2] * fVar2 + transform.m[0] * (float)uVar4 + (float)uVar6 * transform.m[1] +
            local_4c;
      b.y = transform.m[6] * fVar2 + transform.m[4] * (float)uVar4 + (float)uVar6 * transform.m[5] +
            local_50;
      fVar15 = transform.m[2] * fVar7 +
               transform.m[0] * (float)uVar8 + transform.m[1] * (float)uVar9 + local_4c;
      fVar16 = transform.m[6] * fVar7 +
               transform.m[4] * (float)uVar8 + transform.m[5] * (float)uVar9 + local_50;
      local_68 = CONCAT44(fVar16,fVar15);
      local_60 = fVar7 * transform.m[10] + (float)uVar8 * local_54 + (float)uVar9 * transform.m[9] +
                 local_58;
      a.z = fVar1 * transform.m[10] + (float)uVar3 * local_54 + (float)uVar5 * transform.m[9] +
            local_58;
      b.z = fVar2 * transform.m[10] + (float)uVar4 * local_54 + (float)uVar6 * transform.m[9] +
            local_58;
      t0 = 3.4028235e+38;
      c.z = local_60;
      c.x = fVar15;
      c.y = fVar16;
      p.x = (float)local_38._0_4_;
      p.y = (float)local_38._4_4_;
      q.z = rd.z + p.z;
      q.x = (float)local_48;
      q.y = local_48._4_4_;
      _local_48 = auVar10;
      local_38 = auVar11;
      _Var12 = intersect_segment_triangle(p,q,a,b,c,&t0);
      if (!_Var12) {
        t0 = 3.4028235e+38;
      }
      *t = t0;
      uVar13 = uVar13 + 3;
      t = t + 1;
      pvVar14 = pvVar14 + 3;
    } while (uVar13 < (uint)num_points);
  }
  return;
}

Assistant:

void ray_intersect_triangles_all(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t) { 
    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = points[i + 0];
        vec3 tp1 = points[i + 1];
        vec3 tp2 = points[i + 2];
        tp0 = vec3_apply_mat4(tp0, 1.0f, transform);
        tp1 = vec3_apply_mat4(tp1, 1.0f, transform);
        tp2 = vec3_apply_mat4(tp2, 1.0f, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            t[i/3] = t0;    
        }
        else {
            t[i/3] = FLT_MAX;
        }
    }
}